

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_cStreamStage ZVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  void *pvVar7;
  size_t err_code;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  char *dst;
  void *pvVar14;
  void *src;
  ulong uVar15;
  char *dst_00;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong local_90;
  char *local_70;
  
  if (output->size < output->pos) {
    return 0xffffffffffffffba;
  }
  uVar9 = input->size;
  uVar13 = input->pos;
  if (uVar9 < uVar13) {
    return 0xffffffffffffffb8;
  }
  if (ZSTD_e_end < endOp) {
    return 0xffffffffffffffd6;
  }
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1843,
                  "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (cctx->streamStage == zcss_init) {
    sVar12 = (uVar9 - uVar13) + cctx->stableIn_notConsumed;
    if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable)) &&
       (sVar12 < 0x20000)) {
      if ((cctx->stableIn_notConsumed == 0) ||
         ((sVar8 = 0xffffffffffffffce, input->src == (cctx->expectedInBuffer).src &&
          (uVar13 == (cctx->expectedInBuffer).size)))) {
        input->pos = uVar9;
        (cctx->expectedInBuffer).pos = uVar9;
        uVar5 = *(undefined4 *)((long)&input->src + 4);
        sVar8 = input->size;
        uVar6 = *(undefined4 *)((long)&input->size + 4);
        *(undefined4 *)&(cctx->expectedInBuffer).src = *(undefined4 *)&input->src;
        *(undefined4 *)((long)&(cctx->expectedInBuffer).src + 4) = uVar5;
        *(int *)&(cctx->expectedInBuffer).size = (int)sVar8;
        *(undefined4 *)((long)&(cctx->expectedInBuffer).size + 4) = uVar6;
        cctx->stableIn_notConsumed = sVar12;
        sVar8 = (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
      }
LAB_001bcb2f:
      bVar16 = false;
    }
    else {
      sVar8 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar12);
      if (0xffffffffffffff88 < sVar8) goto LAB_001bcb2f;
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
        (cctx->expectedInBuffer).pos = input->pos;
        uVar5 = *(undefined4 *)((long)&input->src + 4);
        sVar12 = input->size;
        uVar6 = *(undefined4 *)((long)&input->size + 4);
        *(undefined4 *)&(cctx->expectedInBuffer).src = *(undefined4 *)&input->src;
        *(undefined4 *)((long)&(cctx->expectedInBuffer).src + 4) = uVar5;
        *(int *)&(cctx->expectedInBuffer).size = (int)sVar12;
        *(undefined4 *)((long)&(cctx->expectedInBuffer).size + 4) = uVar6;
      }
      bVar16 = true;
      if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
        cctx->expectedOutBufferSize = output->size - output->pos;
      }
    }
    if (!bVar16) {
      return sVar8;
    }
  }
  ZVar1 = (cctx->appliedParams).inBufferMode;
  if (ZVar1 == ZSTD_bm_stable) {
    sVar12 = 0xffffffffffffffce;
    bVar16 = true;
    if (((cctx->expectedInBuffer).src != input->src) || ((cctx->expectedInBuffer).pos != input->pos)
       ) goto LAB_001bcb8f;
  }
  if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
     (cctx->expectedOutBufferSize != output->size - output->pos)) {
    sVar12 = 0xffffffffffffffce;
    bVar16 = true;
  }
  else {
    bVar16 = false;
    sVar12 = 0;
  }
LAB_001bcb8f:
  if (!bVar16) {
    if (input == (ZSTD_inBuffer *)0x0) {
      __assert_fail("input != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x16ec,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    pvVar3 = input->src;
    if (pvVar3 == (void *)0x0) {
      pvVar14 = (void *)0x0;
      src = (void *)0x0;
    }
    else {
      pvVar14 = (void *)(input->size + (long)pvVar3);
      src = (void *)(input->pos + (long)pvVar3);
    }
    if (output == (ZSTD_outBuffer *)0x0) {
      __assert_fail("output != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x16ef,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    pvVar4 = output->dst;
    if (pvVar4 == (void *)0x0) {
      local_70 = (char *)0x0;
      dst_00 = (char *)0x0;
    }
    else {
      local_70 = (char *)(output->size + (long)pvVar4);
      dst_00 = (char *)(output->pos + (long)pvVar4);
    }
    if (ZVar1 == ZSTD_bm_stable) {
      uVar9 = cctx->stableIn_notConsumed;
      if (input->pos < uVar9) {
        __assert_fail("input->pos >= zcs->stableIn_notConsumed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x16f8,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
      input->pos = input->pos - uVar9;
      src = (void *)((long)src - uVar9);
      cctx->stableIn_notConsumed = 0;
    }
    if (ZVar1 == ZSTD_bm_buffered) {
      if (cctx->inBuff == (char *)0x0) {
        __assert_fail("zcs->inBuff != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x16fe,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
      if (cctx->inBuffSize == 0) {
        __assert_fail("zcs->inBuffSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x16ff,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
    }
    if ((cctx->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      if (cctx->outBuff == (char *)0x0) {
        __assert_fail("zcs->outBuff != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1702,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
      if (cctx->outBuffSize == 0) {
        __assert_fail("zcs->outBuffSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1703,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
    }
    if ((pvVar3 == (void *)0x0) && (input->size != 0)) {
      __assert_fail("input->size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1705,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (input->size < input->pos) {
      __assert_fail("input->pos <= input->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1706,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if ((pvVar4 == (void *)0x0) && (output->size != 0)) {
      __assert_fail("output->size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1707,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (output->size < output->pos) {
      __assert_fail("output->pos <= output->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1708,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    do {
      ZVar2 = cctx->streamStage;
      if (ZVar2 == zcss_load) {
        if (endOp == ZSTD_e_end) {
          sVar12 = (long)pvVar14 - (long)src;
          if (sVar12 < 0xff00ff00ff00ff00) {
            uVar9 = -(sVar12 - 0x20000) >> 0xb;
            if (0x1ffff < sVar12) {
              uVar9 = 0;
            }
            uVar9 = (sVar12 >> 8) + sVar12 + uVar9;
          }
          else {
            uVar9 = 0;
          }
          if (uVar9 == 0) {
            uVar9 = 0xffffffffffffffb8;
          }
          if ((((ulong)((long)local_70 - (long)dst_00) < uVar9) &&
              ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) || (cctx->inBuffPos != 0))
          goto LAB_001bce61;
          uVar9 = ZSTD_compressEnd_public(cctx,dst_00,(long)local_70 - (long)dst_00,src,sVar12);
          bVar16 = 0xffffffffffffff88 < uVar9;
          if (bVar16) goto LAB_001bd2c9;
          dst_00 = dst_00 + uVar9;
          cctx->streamStage = zcss_init;
          cctx->frameEnded = 1;
          cctx->pledgedSrcSizePlusOne = 0;
          src = pvVar14;
        }
        else {
LAB_001bce61:
          ZVar1 = (cctx->appliedParams).inBufferMode;
          if (ZVar1 == ZSTD_bm_stable) {
            bVar16 = true;
            if (endOp == ZSTD_e_flush) {
              if (src != pvVar14) goto LAB_001bcfcf;
              goto LAB_001bcdf3;
            }
            if ((endOp == ZSTD_e_continue) && ((ulong)((long)pvVar14 - (long)src) < cctx->blockSize)
               ) {
              cctx->stableIn_notConsumed = (long)pvVar14 - (long)src;
              bVar16 = false;
              src = pvVar14;
              goto LAB_001bcdf6;
            }
LAB_001bcfcf:
            ZVar1 = (cctx->appliedParams).inBufferMode;
            if (ZVar1 == ZSTD_bm_buffered) {
              sVar12 = cctx->inBuffPos - cctx->inToCompress;
            }
            else {
              sVar12 = (long)pvVar14 - (long)src;
              if (cctx->blockSize <= (ulong)((long)pvVar14 - (long)src)) {
                sVar12 = cctx->blockSize;
              }
            }
            if (sVar12 < 0xff00ff00ff00ff00) {
              uVar9 = -(sVar12 - 0x20000) >> 0xb;
              if (0x1ffff < sVar12) {
                uVar9 = 0;
              }
              uVar9 = (sVar12 >> 8) + sVar12 + uVar9;
            }
            else {
              uVar9 = 0;
            }
            sVar8 = (long)local_70 - (long)dst_00;
            if (uVar9 == 0) {
              uVar9 = 0xffffffffffffffb8;
            }
            dst = dst_00;
            if ((sVar8 < uVar9) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
              sVar8 = cctx->outBuffSize;
              dst = cctx->outBuff;
            }
            if (ZVar1 == ZSTD_bm_buffered) {
              if (src == pvVar14 && endOp == ZSTD_e_end) {
                uVar9 = ZSTD_compressEnd_public
                                  (cctx,dst,sVar8,cctx->inBuff + cctx->inToCompress,sVar12);
              }
              else {
                uVar9 = ZSTD_compressContinue_internal
                                  (cctx,dst,sVar8,cctx->inBuff + cctx->inToCompress,sVar12,1,0);
              }
              iVar10 = 1;
              if (uVar9 < 0xffffffffffffff89) {
                uVar11 = (uint)(src == pvVar14 && endOp == ZSTD_e_end);
                cctx->frameEnded = uVar11;
                uVar13 = cctx->inBuffPos + cctx->blockSize;
                cctx->inBuffTarget = uVar13;
                if (cctx->inBuffSize < uVar13) {
                  cctx->inBuffPos = 0;
                  cctx->inBuffTarget = cctx->blockSize;
                }
                if ((uVar11 == 0) && (cctx->inBuffSize < cctx->inBuffTarget)) {
                  __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                ,0x175e,
                                "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                               );
                }
                cctx->inToCompress = cctx->inBuffPos;
                goto LAB_001bd1e8;
              }
            }
            else {
              bVar17 = endOp == ZSTD_e_end;
              bVar18 = (void *)((long)src + sVar12) == pvVar14;
              if (bVar18 && bVar17) {
                uVar9 = ZSTD_compressEnd_public(cctx,dst,sVar8,src,sVar12);
              }
              else {
                uVar9 = ZSTD_compressContinue_internal(cctx,dst,sVar8,src,sVar12,1,0);
              }
              if (src != (void *)0x0) {
                src = (void *)((long)src + sVar12);
              }
              iVar10 = 1;
              if (uVar9 < 0xffffffffffffff89) {
                cctx->frameEnded = (uint)(bVar18 && bVar17);
                if (src != pvVar14 && (bVar18 && bVar17)) {
                  __assert_fail("ip == iend",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                ,0x1769,
                                "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                               );
                }
LAB_001bd1e8:
                if (dst == dst_00) {
                  dst_00 = dst_00 + uVar9;
                  iVar10 = 4;
                  uVar9 = local_90;
                  if (cctx->frameEnded != 0) {
                    cctx->streamStage = zcss_init;
                    cctx->pledgedSrcSizePlusOne = 0;
                    bVar16 = false;
                  }
                }
                else {
                  cctx->outBuffContentSize = uVar9;
                  cctx->outBuffFlushedSize = 0;
                  cctx->streamStage = zcss_flush;
                  iVar10 = 0;
                  uVar9 = local_90;
                }
              }
            }
            local_90 = uVar9;
            if (iVar10 != 4) {
              uVar9 = local_90;
              if (iVar10 == 0) goto LAB_001bcd1e;
              goto LAB_001bd2c9;
            }
          }
          else {
            if (ZVar1 != ZSTD_bm_buffered) {
              __assert_fail("zcs->appliedParams.inBufferMode == ZSTD_bm_stable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1734,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            uVar13 = cctx->inBuffTarget - cctx->inBuffPos;
            uVar9 = (long)pvVar14 - (long)src;
            if (uVar13 < (ulong)((long)pvVar14 - (long)src)) {
              uVar9 = uVar13;
            }
            if (uVar9 != 0) {
              memcpy(cctx->inBuff + cctx->inBuffPos,src,uVar9);
            }
            uVar13 = uVar9 + cctx->inBuffPos;
            cctx->inBuffPos = uVar13;
            pvVar7 = (void *)((long)src + uVar9);
            if (src == (void *)0x0) {
              pvVar7 = src;
            }
            src = pvVar7;
            if (endOp == ZSTD_e_flush) {
              bVar17 = false;
              bVar16 = false;
              if (uVar13 != cctx->inToCompress) goto LAB_001bcf01;
            }
            else {
              if (endOp == ZSTD_e_continue) {
                bVar17 = false;
                bVar16 = false;
                if (uVar13 < cctx->inBuffTarget) goto LAB_001bcf09;
              }
LAB_001bcf01:
              bVar16 = true;
              bVar17 = true;
            }
LAB_001bcf09:
            if (bVar17) goto LAB_001bcfcf;
          }
        }
      }
      else {
        bVar16 = true;
        if (ZVar2 != zcss_flush) {
          local_90 = 0xffffffffffffffc2;
          uVar9 = local_90;
          if (ZVar2 != zcss_init) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1796,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          goto LAB_001bd2c9;
        }
LAB_001bcd1e:
        if ((cctx->appliedParams).outBufferMode != ZSTD_bm_buffered) {
          __assert_fail("zcs->appliedParams.outBufferMode == ZSTD_bm_buffered",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x177b,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        uVar15 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
        uVar13 = (long)local_70 - (long)dst_00;
        uVar9 = uVar15;
        if (uVar13 < uVar15) {
          uVar9 = uVar13;
        }
        if (uVar9 != 0) {
          memcpy(dst_00,cctx->outBuff + cctx->outBuffFlushedSize,uVar9);
        }
        dst_00 = dst_00 + uVar9;
        cctx->outBuffFlushedSize = cctx->outBuffFlushedSize + uVar9;
        if (uVar13 < uVar15) {
          if (dst_00 != local_70) {
            __assert_fail("op==oend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1786,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        else {
          cctx->outBuffContentSize = 0;
          cctx->outBuffFlushedSize = 0;
          if (cctx->frameEnded == 0) {
            cctx->streamStage = zcss_load;
            goto LAB_001bcdf6;
          }
          cctx->streamStage = zcss_init;
          cctx->pledgedSrcSizePlusOne = 0;
        }
LAB_001bcdf3:
        bVar16 = false;
      }
LAB_001bcdf6:
    } while (bVar16);
    input->pos = (long)src - (long)pvVar3;
    output->pos = (long)dst_00 - (long)pvVar4;
    if (cctx->frameEnded == 0) {
      uVar9 = ZSTD_nextInputSizeHint(cctx);
    }
    else {
      local_90 = 0;
      uVar9 = local_90;
    }
LAB_001bd2c9:
    local_90 = uVar9;
    sVar12 = local_90;
    if (local_90 < 0xffffffffffffff89) {
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
        (cctx->expectedInBuffer).pos = input->pos;
        sVar12 = input->size;
        (cctx->expectedInBuffer).src = input->src;
        (cctx->expectedInBuffer).size = sVar12;
      }
      if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
        cctx->expectedOutBufferSize = output->size - output->pos;
      }
      sVar12 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
  }
  return sVar12;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}